

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

int __thiscall HttpResponse::parseFirstLine(HttpResponse *this,CircularBuffer *buf)

{
  undefined4 uVar1;
  undefined4 i_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  char *local_70;
  char *endptr;
  char *nptr;
  uint local_4c;
  string local_48 [4];
  anon_enum_32 state;
  string statusCodeStr;
  char c;
  int i;
  CircularBuffer *buf_local;
  HttpResponse *this_local;
  
  statusCodeStr.field_2._12_4_ = 0;
  statusCodeStr.field_2._M_local_buf[0xb] = '\0';
  std::__cxx11::string::string(local_48);
  local_4c = 0;
  iVar2 = JetHead::CircularBuffer::getLength(buf);
  if (iVar2 < 2) {
    uVar3 = JetHead::CircularBuffer::getLength(buf);
    jh_log_print(0,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                 ,0x86,"called with only %d bytes in buffer",(ulong)uVar3);
    this_local._4_4_ = -1;
  }
  else {
    iVar2 = JetHead::CircularBuffer::byteAt(buf,0);
    if ((iVar2 != 0xd) || (iVar2 = JetHead::CircularBuffer::byteAt(buf,1), iVar2 != 10)) {
LAB_0012767f:
      uVar1 = statusCodeStr.field_2._12_4_;
      iVar2 = JetHead::CircularBuffer::getLength(buf);
      i_00 = statusCodeStr.field_2._12_4_;
      if (iVar2 <= (int)uVar1 || local_4c == 5) {
        iVar2 = JetHead::CircularBuffer::getLength(buf);
        jh_log_print(0,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                     ,0xf4,"problem at %d parsing buffer of length %d, state %d",(ulong)(uint)i_00,
                     iVar2,local_4c);
        this_local._4_4_ = -1;
        goto LAB_001279ad;
      }
      statusCodeStr.field_2._12_4_ = statusCodeStr.field_2._12_4_ + 1;
      iVar2 = JetHead::CircularBuffer::byteAt(buf,i_00);
      statusCodeStr.field_2._M_local_buf[0xb] = (char)iVar2;
      switch(local_4c) {
      case 0:
        if (statusCodeStr.field_2._M_local_buf[0xb] != ' ') goto LAB_0012767f;
        local_4c = 1;
switchD_0012771a_caseD_1:
        if (statusCodeStr.field_2._M_local_buf[0xb] != ' ') {
          local_4c = 2;
switchD_0012771a_caseD_2:
          if (statusCodeStr.field_2._M_local_buf[0xb] == ' ') {
            endptr = (char *)std::__cxx11::string::c_str();
            local_70 = (char *)0x0;
            piVar5 = __errno_location();
            *piVar5 = 0;
            lVar6 = strtol(endptr,&local_70,10);
            this->mResponseCode = (int)lVar6;
            if ((endptr == local_70) || (piVar5 = __errno_location(), *piVar5 != 0)) {
              jh_log_print(1,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                           ,0xbd,"problem converting %s to int",endptr);
              local_4c = 5;
            }
            else {
              local_4c = 3;
switchD_0012771a_caseD_3:
              if (statusCodeStr.field_2._M_local_buf[0xb] != ' ') {
                local_4c = 4;
switchD_0012771a_caseD_4:
                uVar1 = statusCodeStr.field_2._12_4_;
                if ((statusCodeStr.field_2._M_local_buf[0xb] == '\r') ||
                   (statusCodeStr.field_2._M_local_buf[0xb] == '\n')) goto LAB_00127823;
              }
            }
          }
          else {
            std::__cxx11::string::operator+=(local_48,statusCodeStr.field_2._M_local_buf[0xb]);
          }
        }
        goto LAB_0012767f;
      case 1:
        goto switchD_0012771a_caseD_1;
      case 2:
        goto switchD_0012771a_caseD_2;
      case 3:
        goto switchD_0012771a_caseD_3;
      case 4:
        goto switchD_0012771a_caseD_4;
      default:
        jh_log_print(1,"virtual int HttpResponse::parseFirstLine(const CircularBuffer &)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/HttpResponse.cpp"
                     ,0xec,"invalid state %d",(ulong)local_4c);
        local_4c = 5;
        goto LAB_0012767f;
      }
    }
    this_local._4_4_ = 2;
  }
LAB_001279ad:
  nptr._0_4_ = 1;
  std::__cxx11::string::~string(local_48);
  return this_local._4_4_;
LAB_00127823:
  iVar2 = JetHead::CircularBuffer::getLength(buf);
  if (((int)uVar1 < iVar2) &&
     (iVar2 = JetHead::CircularBuffer::byteAt(buf,statusCodeStr.field_2._12_4_), iVar2 == 10)) {
    statusCodeStr.field_2._12_4_ = statusCodeStr.field_2._12_4_ + 1;
  }
  if ((((this->mResponseCode == 100) &&
       (iVar2 = statusCodeStr.field_2._12_4_ + 1, iVar4 = JetHead::CircularBuffer::getLength(buf),
       iVar2 < iVar4)) &&
      (iVar2 = JetHead::CircularBuffer::byteAt(buf,statusCodeStr.field_2._12_4_), iVar2 == 0xd)) &&
     (iVar2 = JetHead::CircularBuffer::byteAt(buf,statusCodeStr.field_2._12_4_ + 1), iVar2 == 10)) {
    statusCodeStr.field_2._12_4_ = statusCodeStr.field_2._12_4_ + 2;
  }
  this_local._4_4_ = statusCodeStr.field_2._12_4_;
  goto LAB_001279ad;
}

Assistant:

int HttpResponse::parseFirstLine( const CircularBuffer &buf )
{
	TRACE_BEGIN( LOG_LVL_INFO );

	int i = 0;
	char c = 0;

	std::string statusCodeStr;

	enum { ParseProtocol,
		   SeekStatusCode,
		   ParseStatusCode,
		   SeekStatusText,
		   ParseStatusText,
		   ParsingError } state = ParseProtocol;

	// We should only be called on buffers that contain at least two
	// bytes of CRLF
	if (buf.getLength() <= 1)
	{
		LOG_ERR("called with only %d bytes in buffer", buf.getLength());
		return -1;
	}
	
	// In the case of having got a 100, we might now get a blank line
	// before the real header.
	if (buf.byteAt(0) == '\r' and buf.byteAt(1) == '\n')
	{
		return 2;
	}
	
	while(i < buf.getLength() and state != ParsingError)
	{
		c = buf.byteAt(i++);
		
		switch(state)
		{
		case ParseProtocol:
			if (c != ' ')
			{
				// append c to protocol string, unimplemented for now
				break;
			}
			state = SeekStatusCode;
			// found a space, so fall through to the next state to
			// handle the space
			
		case SeekStatusCode:
			if (c == ' ')
			{
				// skip over spaces to get to status code
				break;
			}
			state = ParseStatusCode;
			// found a non-space, so fall through to the next state to
			// handle the non-space char
			
		case ParseStatusCode:
			if (c != ' ')
			{
				// append c to status code string
				statusCodeStr += c;
				break;
			}
			// found a space, convert statusCodeStr to int
			else
			{
				const char* nptr = statusCodeStr.c_str();
				char* endptr = NULL;
				errno = 0;
				
				mResponseCode = strtol(nptr, &endptr, 10);

				if (nptr == endptr or errno != 0)
				{
					LOG_ERR_PERROR("problem converting %s to int", nptr);
					state = ParsingError;
					break;
				}
			}

			state = SeekStatusText;
			// found a space, so fall through to the next state to
			// handle the space

		case SeekStatusText:
			if (c == ' ')
			{
				// skip over spaces to get to status text
				break;
			}
			state = ParseStatusText;
			// found a non-space, so fall through to the next state to
			// handle the non-space char

		case ParseStatusText:
			if (c != '\r' and c != '\n')
			{
				// append c to status text string, unimplemented for now
				break;
			}

			// if CRLF move past LF
			if (i < buf.getLength() and buf.byteAt(i) == '\n')
			{
				++i;
			}

			// If we got a 100 and there is enough data in the buffer
			// for the (possible) additional \r\n, then consume those
			// now too.
			if ( mResponseCode == 100 and i + 1 < buf.getLength() and
				 buf.byteAt(i) == '\r' and buf.byteAt(i + 1) == '\n' )
			{
				i += 2;
			}

			// Parsing complete, return the number of bytes to be
			// removed from the buffer
			return i;

		default:
			LOG_ERR_FATAL("invalid state %d", state);
			state = ParsingError;
		}
	}

	// If we exited the parsing loop, then encountered an error while
	// parsing or ran out of data, so return an error
	LOG_ERR("problem at %d parsing buffer of length %d, state %d",
			i, buf.getLength(), state);

	return -1;
}